

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O2

Abc_Obj_t * Lpk_Implement(Lpk_Man_t *pMan,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLeaves,int nLeavesOld)

{
  void *pvVar1;
  Lpk_Fun_t *pFun;
  Abc_Obj_t *pAVar2;
  int i;
  int iVar3;
  
  if (nLeavesOld < vLeaves->nSize) {
    iVar3 = 0;
    i = 0;
    if (0 < nLeavesOld) {
      iVar3 = nLeavesOld;
      i = 0;
    }
    for (; iVar3 != i; i = i + 1) {
      pvVar1 = Vec_PtrEntry(vLeaves,i);
      Vec_PtrWriteEntry(vLeaves,i,(void *)((ulong)pvVar1 ^ 1));
    }
    pFun = (Lpk_Fun_t *)Vec_PtrEntry(vLeaves,nLeavesOld);
    pAVar2 = Lpk_Implement_rec(pMan,pNtk,vLeaves,pFun);
    Vec_PtrShrink(vLeaves,nLeavesOld);
    return pAVar2;
  }
  __assert_fail("nLeavesOld < Vec_PtrSize(vLeaves)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDec.c"
                ,0x7c,"Abc_Obj_t *Lpk_Implement(Lpk_Man_t *, Abc_Ntk_t *, Vec_Ptr_t *, int)");
}

Assistant:

Abc_Obj_t * Lpk_Implement( Lpk_Man_t * pMan, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLeaves, int nLeavesOld )
{
    Abc_Obj_t * pFanin, * pRes;
    int i;
    assert( nLeavesOld < Vec_PtrSize(vLeaves) );
    // mark implemented nodes
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vLeaves, pFanin, i, nLeavesOld )
        Vec_PtrWriteEntry( vLeaves, i, Abc_ObjNot(pFanin) );
    // recursively construct starting from the first entry
    pRes = Lpk_Implement_rec( pMan, pNtk, vLeaves, (Lpk_Fun_t *)Vec_PtrEntry( vLeaves, nLeavesOld ) );
    Vec_PtrShrink( vLeaves, nLeavesOld );
    return pRes;
}